

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_resize(bitset_t *bitset,size_t newarraysize,_Bool padwithzeroes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t *puVar4;
  size_t sVar5;
  
  if (newarraysize >> 0x3a != 0) {
    return false;
  }
  uVar1 = bitset->arraysize;
  uVar2 = bitset->capacity;
  sVar5 = newarraysize;
  if (uVar1 < newarraysize) {
    sVar5 = uVar1;
  }
  if (uVar2 < newarraysize) {
    uVar2 = uVar2 + (uVar2 == 0);
    do {
      uVar3 = uVar2;
      uVar2 = uVar3 * 2;
    } while (uVar3 < newarraysize);
    puVar4 = (uint64_t *)(*global_memory_hook.realloc)(bitset->array,uVar3 * 8);
    if (puVar4 == (uint64_t *)0x0) {
      return false;
    }
    bitset->capacity = uVar3;
    bitset->array = puVar4;
  }
  if (uVar1 < newarraysize && padwithzeroes) {
    memset(bitset->array + sVar5,0,(newarraysize - sVar5) * 8);
  }
  bitset->arraysize = newarraysize;
  return true;
}

Assistant:

bool bitset_resize(bitset_t *bitset, size_t newarraysize, bool padwithzeroes) {
    if (newarraysize > SIZE_MAX / 64) {
        return false;
    }
    size_t smallest =
        newarraysize < bitset->arraysize ? newarraysize : bitset->arraysize;
    if (bitset->capacity < newarraysize) {
        uint64_t *newarray;
        size_t newcapacity = bitset->capacity;
        if (newcapacity == 0) {
            newcapacity = 1;
        }
        while (newcapacity < newarraysize) {
            newcapacity *= 2;
        }
        if ((newarray = (uint64_t *)roaring_realloc(
                 bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
            return false;
        }
        bitset->capacity = newcapacity;
        bitset->array = newarray;
    }
    if (padwithzeroes && (newarraysize > smallest))
        memset(bitset->array + smallest, 0,
               sizeof(uint64_t) * (newarraysize - smallest));
    bitset->arraysize = newarraysize;
    return true;  // success!
}